

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::writeStandard(QPDFWriter *this)

{
  size_t *psVar1;
  int size;
  string *psVar2;
  size_type max_offset;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  size_type *psVar4;
  element_type *peVar5;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  PipelinePopper pp_md5;
  QPDFObjectHandle cur_object;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  pp_md5.stack_id = 0;
  pp_md5.qw = this;
  if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      deterministic_id == true) {
    pushMD5Pipeline(this,&pp_md5);
  }
  writeHeader(this);
  peVar5 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  str._M_str = (peVar5->extra_header_text)._M_dataplus._M_p;
  str._M_len = (peVar5->extra_header_text)._M_string_length;
  writeString(this,str);
  if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pclm
      == true) {
    enqueueObjectsPCLm(this);
  }
  else {
    enqueueObjectsStandard(this);
  }
  while( true ) {
    peVar5 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((ulong)((long)*(pointer *)
                       ((long)&(peVar5->object_queue).
                               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                               ._M_impl.super__Vector_impl_data + 8) -
                (long)(peVar5->object_queue).
                      super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) <= peVar5->object_queue_front)
    break;
    p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                       (&peVar5->object_queue,peVar5->object_queue_front);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&cur_object,p_Var3);
    psVar1 = &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->object_queue_front;
    *psVar1 = *psVar1 + 1;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&cur_object);
    writeObject(this,(QPDFObjectHandle *)&local_40,-1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cur_object.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  if (peVar5->encrypted == true) {
    writeEncryptionDictionary(this);
    peVar5 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  psVar2 = peVar5->pipeline->str;
  psVar4 = (size_type *)&peVar5->pipeline->count;
  if (psVar2 != (string *)0x0) {
    psVar4 = &psVar2->_M_string_length;
  }
  max_offset = *psVar4;
  size = peVar5->next_objid;
  if (*(size_t *)
       ((long)&(peVar5->object_stream_to_objects)._M_t._M_impl.super__Rb_tree_header + 0x20) == 0) {
    writeXRefTable(this,t_normal,0,size + -1,size);
  }
  else {
    peVar5->next_objid = size + 1;
    writeXRefStream(this,size,size,max_offset,t_normal,0,size,size + 1);
  }
  str_00._M_str = "startxref\n";
  str_00._M_len = 10;
  writeString(this,str_00);
  std::__cxx11::to_string((string *)&cur_object,max_offset);
  str_01._M_str =
       (char *)cur_object.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  str_01._M_len =
       (size_t)cur_object.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  writeString(this,str_01);
  std::__cxx11::string::~string((string *)&cur_object);
  str_02._M_str = "\n%%EOF\n";
  str_02._M_len = 7;
  writeString(this,str_02);
  PipelinePopper::~PipelinePopper(&pp_md5);
  return;
}

Assistant:

void
QPDFWriter::writeStandard()
{
    auto pp_md5 = PipelinePopper(this);
    if (m->deterministic_id) {
        pushMD5Pipeline(pp_md5);
    }

    // Start writing

    writeHeader();
    writeString(m->extra_header_text);

    if (m->pclm) {
        enqueueObjectsPCLm();
    } else {
        enqueueObjectsStandard();
    }

    // Now start walking queue, outputting each object.
    while (m->object_queue_front < m->object_queue.size()) {
        QPDFObjectHandle cur_object = m->object_queue.at(m->object_queue_front);
        ++m->object_queue_front;
        writeObject(cur_object);
    }

    // Write out the encryption dictionary, if any
    if (m->encrypted) {
        writeEncryptionDictionary();
    }

    // Now write out xref.  next_objid is now the number of objects.
    qpdf_offset_t xref_offset = m->pipeline->getCount();
    if (m->object_stream_to_objects.empty()) {
        // Write regular cross-reference table
        writeXRefTable(t_normal, 0, m->next_objid - 1, m->next_objid);
    } else {
        // Write cross-reference stream.
        int xref_id = m->next_objid++;
        writeXRefStream(
            xref_id, xref_id, xref_offset, t_normal, 0, m->next_objid - 1, m->next_objid);
    }
    writeString("startxref\n");
    writeString(std::to_string(xref_offset));
    writeString("\n%%EOF\n");

    if (m->deterministic_id) {
        QTC::TC(
            "qpdf",
            "QPDFWriter standard deterministic ID",
            m->object_stream_to_objects.empty() ? 0 : 1);
    }
}